

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Line_Up(black_PWorker worker,Long x1,Long y1,Long x2,Long y2,Long miny,Long maxy)

{
  long lVar1;
  long c_;
  FT_Long FVar2;
  PLong local_88;
  PLong top;
  Long Ax;
  Long Rx;
  Long Ix;
  uint local_60;
  Int size;
  Int f2;
  Int f1;
  Int e2;
  Int e1;
  Long Dy;
  Long Dx;
  Long miny_local;
  Long y2_local;
  Long x2_local;
  Long y1_local;
  Long x1_local;
  black_PWorker worker_local;
  
  lVar1 = x2 - x1;
  c_ = y2 - y1;
  if (((c_ < 1) || (y2 < miny)) || (maxy < y1)) {
    worker_local._7_1_ = '\0';
  }
  else {
    if (y1 < miny) {
      FVar2 = FT_MulDiv(lVar1,miny - y1,c_);
      y1_local = FVar2 + x1;
      f1 = (Int)(miny >> ((byte)worker->precision_bits & 0x3f));
      size = 0;
    }
    else {
      f1 = (Int)(y1 >> ((byte)worker->precision_bits & 0x3f));
      size = (uint)y1 & worker->precision - 1U;
      y1_local = x1;
    }
    if (maxy < y2) {
      f2 = (Int)(maxy >> ((byte)worker->precision_bits & 0x3f));
      local_60 = 0;
    }
    else {
      f2 = (Int)(y2 >> ((byte)worker->precision_bits & 0x3f));
      local_60 = (uint)y2 & worker->precision - 1U;
    }
    if (size < 1) {
      if (worker->joint != '\0') {
        worker->top = worker->top + -1;
        worker->joint = '\0';
      }
    }
    else {
      if (f1 == f2) {
        return '\0';
      }
      FVar2 = FT_MulDiv(lVar1,(long)(worker->precision - size),c_);
      y1_local = FVar2 + y1_local;
      f1 = f1 + 1;
    }
    worker->joint = local_60 == 0;
    if (worker->fresh != '\0') {
      worker->cProfile->start = (long)f1;
      worker->fresh = '\0';
    }
    Ix._4_4_ = (f2 - f1) + 1;
    if (worker->top + Ix._4_4_ < worker->maxBuff) {
      if (lVar1 < 1) {
        FVar2 = FT_MulDiv_No_Round((long)worker->precision,-lVar1,c_);
        Rx = -FVar2;
        lVar1 = (long)worker->precision * -lVar1;
        Dy = -1;
      }
      else {
        Rx = FT_MulDiv_No_Round((long)worker->precision,lVar1,c_);
        lVar1 = worker->precision * lVar1;
        Dy = 1;
      }
      Ax = lVar1 % c_;
      top = (PLong)-c_;
      local_88 = worker->top;
      for (; 0 < Ix._4_4_; Ix._4_4_ = Ix._4_4_ + -1) {
        *local_88 = y1_local;
        y1_local = Rx + y1_local;
        top = (PLong)(Ax + (long)top);
        if (-1 < (long)top) {
          top = (PLong)((long)top - c_);
          y1_local = Dy + y1_local;
        }
        local_88 = local_88 + 1;
      }
      worker->top = local_88;
      worker_local._7_1_ = '\0';
    }
    else {
      worker->error = 0x62;
      worker_local._7_1_ = '\x01';
    }
  }
  return worker_local._7_1_;
}

Assistant:

static Bool
  Line_Up( RAS_ARGS Long  x1,
                    Long  y1,
                    Long  x2,
                    Long  y2,
                    Long  miny,
                    Long  maxy )
  {
    Long   Dx, Dy;
    Int    e1, e2, f1, f2, size;     /* XXX: is `Short' sufficient? */
    Long   Ix, Rx, Ax;

    PLong  top;


    Dx = x2 - x1;
    Dy = y2 - y1;

    if ( Dy <= 0 || y2 < miny || y1 > maxy )
      return SUCCESS;

    if ( y1 < miny )
    {
      /* Take care: miny-y1 can be a very large value; we use     */
      /*            a slow MulDiv function to avoid clipping bugs */
      x1 += SMulDiv( Dx, miny - y1, Dy );
      e1  = (Int)TRUNC( miny );
      f1  = 0;
    }
    else
    {
      e1 = (Int)TRUNC( y1 );
      f1 = (Int)FRAC( y1 );
    }

    if ( y2 > maxy )
    {
      /* x2 += FMulDiv( Dx, maxy - y2, Dy );  UNNECESSARY */
      e2  = (Int)TRUNC( maxy );
      f2  = 0;
    }
    else
    {
      e2 = (Int)TRUNC( y2 );
      f2 = (Int)FRAC( y2 );
    }

    if ( f1 > 0 )
    {
      if ( e1 == e2 )
        return SUCCESS;
      else
      {
        x1 += SMulDiv( Dx, ras.precision - f1, Dy );
        e1 += 1;
      }
    }
    else
      if ( ras.joint )
      {
        ras.top--;
        ras.joint = FALSE;
      }

    ras.joint = (char)( f2 == 0 );

    if ( ras.fresh )
    {
      ras.cProfile->start = e1;
      ras.fresh           = FALSE;
    }

    size = e2 - e1 + 1;
    if ( ras.top + size >= ras.maxBuff )
    {
      ras.error = FT_THROW( Overflow );
      return FAILURE;
    }

    if ( Dx > 0 )
    {
      Ix = SMulDiv_No_Round( ras.precision, Dx, Dy );
      Rx = ( ras.precision * Dx ) % Dy;
      Dx = 1;
    }
    else
    {
      Ix = -SMulDiv_No_Round( ras.precision, -Dx, Dy );
      Rx = ( ras.precision * -Dx ) % Dy;
      Dx = -1;
    }

    Ax  = -Dy;
    top = ras.top;

    while ( size > 0 )
    {
      *top++ = x1;

      x1 += Ix;
      Ax += Rx;
      if ( Ax >= 0 )
      {
        Ax -= Dy;
        x1 += Dx;
      }
      size--;
    }

    ras.top = top;
    return SUCCESS;
  }